

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,
              secp256k1_surjectionproof *proof)

{
  size_t sVar1;
  size_t __n;
  ulong uVar2;
  size_t serialized_len;
  size_t signature_len;
  secp256k1_surjectionproof *proof_local;
  size_t *outputlen_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  if (output == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (outputlen == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"outputlen != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    sVar1 = secp256k1_count_bits_set(proof->used_inputs,proof->n_inputs + 7 >> 3);
    __n = (sVar1 + 1) * 0x20;
    uVar2 = (proof->n_inputs + 7 >> 3) + 2 + __n;
    if (*outputlen < uVar2) {
      ctx_local._4_4_ = 0;
    }
    else {
      *output = (uchar)proof->n_inputs;
      output[1] = (uchar)(proof->n_inputs >> 8);
      memcpy(output + 2,proof->used_inputs,proof->n_inputs + 7 >> 3);
      memcpy(output + (proof->n_inputs + 7 >> 3) + 2,proof->data,__n);
      *outputlen = uVar2;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_surjectionproof_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_surjectionproof *proof) {
    size_t signature_len;
    size_t serialized_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(proof != NULL);
    (void) ctx;

    signature_len = 32 * (1 + secp256k1_count_bits_set(proof->used_inputs, (proof->n_inputs + 7) / 8));
    serialized_len = 2 + (proof->n_inputs + 7) / 8 + signature_len;
    if (*outputlen < serialized_len) {
        return 0;
    }

    output[0] = proof->n_inputs % 0x100;
    output[1] = proof->n_inputs / 0x100;
    memcpy(&output[2], proof->used_inputs, (proof->n_inputs + 7) / 8);
    memcpy(&output[2 + (proof->n_inputs + 7) / 8], proof->data, signature_len);
    *outputlen = serialized_len;

    return 1;
}